

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

void x86ReserveLabels(uint count)

{
  FastVector<unsigned_char_*,_false,_false>::resize(&labels,count);
  return;
}

Assistant:

void x86ReserveLabels(unsigned int count)
{
	labels.resize(count);
}